

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O3

void cf_thread_setname(cf_thread_t t,char *name)

{
  pthread_setname_np(t,name);
  return;
}

Assistant:

void cf_thread_setname(cf_thread_t t, const char* name) {
#ifdef CF_OS_WIN
    SetThreadName(GetThreadId(t), CF_TYPE_CAST(char*, name));
#elif defined(CF_OS_MAC)
    pthread_setname_np(name);
#else
    pthread_setname_np(t, name);
#endif
}